

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchIRBuilder.h
# Opt level: O0

void __thiscall SwitchIRBuilder::SwitchIRBuilder(SwitchIRBuilder *this,SwitchAdapter *adapter)

{
  SwitchAdapter *adapter_local;
  SwitchIRBuilder *this_local;
  
  this->m_adapter = adapter;
  this->m_seenOnlySingleCharStrCaseNodes = true;
  this->m_profiledSwitchInstr = (Instr *)0x0;
  this->m_isAsmJs = false;
  this->m_switchOptBuildBail = false;
  this->m_switchIntDynProfile = false;
  this->m_switchStrDynProfile = false;
  return;
}

Assistant:

SwitchIRBuilder(SwitchAdapter * adapter)
        : m_adapter(adapter)
        , m_profiledSwitchInstr(nullptr)
        , m_switchOptBuildBail(false)
        , m_switchIntDynProfile(false)
        , m_switchStrDynProfile(false)
        , m_isAsmJs(false)
        , m_seenOnlySingleCharStrCaseNodes(true) {}